

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void __thiscall
icu_63::DecimalFormat::setPositiveSuffix(DecimalFormat *this,UnicodeString *newValue)

{
  UBool UVar1;
  DecimalFormatProperties *pDVar2;
  UnicodeString *newValue_local;
  DecimalFormat *this_local;
  
  pDVar2 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                     ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                      this->fields);
  UVar1 = UnicodeString::operator==(newValue,&pDVar2->positiveSuffix);
  if (UVar1 == '\0') {
    pDVar2 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                        this->fields);
    UnicodeString::operator=(&pDVar2->positiveSuffix,newValue);
    touchNoError(this);
  }
  return;
}

Assistant:

void DecimalFormat::setPositiveSuffix(const UnicodeString& newValue) {
    if (newValue == fields->properties->positiveSuffix) { return; }
    fields->properties->positiveSuffix = newValue;
    touchNoError();
}